

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::BrokerBase(BrokerBase *this,bool DisableQueue)

{
  int iVar1;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *unaff_retaddr;
  double in_stack_ffffffffffffffd8;
  double t;
  __integral_type_conflict __i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar4;
  
  uVar4 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  *in_RDI = &PTR__BrokerBase_0092cbe8;
  uVar3 = 0;
  CLI::std::atomic<helics::GlobalBrokerId>::atomic
            ((atomic<helics::GlobalBrokerId> *)(in_RDI + 1),(GlobalBrokerId)0x0);
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  GlobalBrokerId::GlobalBrokerId((GlobalBrokerId *)((long)in_RDI + 0xc));
  uVar2 = 0;
  GlobalBrokerId::GlobalBrokerId((GlobalBrokerId *)(in_RDI + 2),0);
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
             (__integral_type_conflict)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  *(undefined4 *)(in_RDI + 3) = 1;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  iVar1 = CLI::std::numeric_limits<int>::max();
  *(int *)(in_RDI + 4) = iVar1;
  iVar1 = CLI::std::numeric_limits<int>::max();
  *(int *)((long)in_RDI + 0x24) = iVar1;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 10000;
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  t = -1.0;
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
             -1.0);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),t
            );
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),t
            );
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),t
            );
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),t
            );
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar4,uVar3));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar4,uVar3));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar4,uVar3));
  std::thread::thread((thread *)0x44167b);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),SUB81((ulong)t >> 0x38,0));
  *(undefined1 *)((long)in_RDI + 0xd1) = 0;
  *(undefined1 *)((long)in_RDI + 0xd2) = 0;
  *(undefined1 *)((long)in_RDI + 0xd3) = 0;
  *(undefined1 *)((long)in_RDI + 0xd4) = 0;
  *(undefined1 *)((long)in_RDI + 0xd5) = 0;
  *(undefined1 *)((long)in_RDI + 0xd6) = 0;
  *(undefined1 *)((long)in_RDI + 0xd7) = 0;
  *(undefined1 *)(in_RDI + 0x1b) = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),SUB81((ulong)t >> 0x38,0));
  *(undefined1 *)((long)in_RDI + 0xda) = 0;
  *(byte *)((long)in_RDI + 0xdb) = (byte)(uVar4 >> 0x18) & 1;
  *(undefined1 *)((long)in_RDI + 0xdc) = 0;
  CLI::std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
             (__integral_type_conflict2)t);
  __i = (__integral_type_conflict)((ulong)t >> 0x20);
  std::unique_ptr<helics::BaseTimeCoordinator,std::default_delete<helics::BaseTimeCoordinator>>::
  unique_ptr<std::default_delete<helics::BaseTimeCoordinator>,void>
            ((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
              *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  BlockingPriorityQueue(unaff_retaddr);
  CLI::std::make_shared<helics::LogManager>();
  *(undefined1 *)(in_RDI + 0x41) = 0;
  *(undefined1 *)((long)in_RDI + 0x209) = 0;
  *(undefined1 *)((long)in_RDI + 0x20a) = 0;
  *(undefined1 *)((long)in_RDI + 0x20b) = 0;
  *(undefined1 *)((long)in_RDI + 0x20c) = 0;
  *(undefined1 *)((long)in_RDI + 0x20d) = 0;
  *(undefined1 *)((long)in_RDI + 0x20e) = 0;
  *(undefined1 *)((long)in_RDI + 0x20f) = 0;
  *(undefined1 *)(in_RDI + 0x42) = 0;
  *(undefined1 *)((long)in_RDI + 0x211) = 1;
  *(undefined1 *)((long)in_RDI + 0x212) = 0;
  *(undefined1 *)((long)in_RDI + 0x213) = 0;
  CLI::std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  CLI::std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  std::atomic<int>::atomic((atomic<int> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),__i);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar4,uVar3));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar4,uVar3));
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  CLI::std::shared_ptr<helics::ProfilerBuffer>::shared_ptr
            ((shared_ptr<helics::ProfilerBuffer> *)0x44180d);
  *(undefined1 *)(in_RDI + 0x51) = 0;
  *(undefined4 *)((long)in_RDI + 0x28c) = 0;
  CLI::std::atomic<helics::BrokerBase::BrokerState>::atomic
            ((atomic<helics::BrokerBase::BrokerState> *)(in_RDI + 0x52),CREATED);
  return;
}

Assistant:

BrokerBase::BrokerBase(bool DisableQueue) noexcept:
    queueDisabled(DisableQueue), mLogManager(std::make_shared<LogManager>())
{
}